

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_math.c
# Opt level: O1

int jpc_fix_firstone(jpc_fix_t x)

{
  long lVar1;
  
  if (-1 < x) {
    lVar1 = 0x3f;
    if (x != 0) {
      for (; (ulong)x >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    return -(uint)(x == 0) | (uint)lVar1;
  }
  __assert_fail("x >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_math.c"
                ,0x7b,"int jpc_fix_firstone(jpc_fix_t)");
}

Assistant:

int jpc_fix_firstone(jpc_fix_t x)
{
	int n;

	/* The argument must be nonnegative. */
	assert(x >= 0);

	n = -1;
	while (x > 0) {
		x >>= 1;
		++n;
	}
	return n;
}